

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O3

WriteAheadLogDeserializer *
duckdb::WriteAheadLogDeserializer::Open
          (WriteAheadLogDeserializer *__return_storage_ptr__,ReplayState *state_p,
          BufferedFileReader *stream,bool deserialize_only)

{
  _Alloc_hider params_1;
  uint8_t *buffer;
  pointer pcVar1;
  IOException *pIVar2;
  SerializationException *this;
  unsigned_long value;
  string local_68;
  uint64_t local_48;
  pointer local_40;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  
  if (state_p->wal_version == 2) {
    (**(stream->super_ReadStream)._vptr_ReadStream)(stream,&local_68,8);
    params_1._M_p = local_68._M_dataplus._M_p;
    (**(stream->super_ReadStream)._vptr_ReadStream)(stream,&local_68,8);
    local_40 = local_68._M_dataplus._M_p;
    local_48 = BufferedFileReader::CurrentOffset(stream);
    pcVar1 = (pointer)stream->file_size;
    if (pcVar1 < params_1._M_p + local_48) {
      this = (SerializationException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "Corrupt WAL file: entry size exceeded remaining data in file at byte position %llu (found entry with size %llu bytes, file size %llu bytes)"
                 ,"");
      SerializationException::SerializationException<unsigned_long,unsigned_long,unsigned_long>
                (this,&local_68,local_48,(unsigned_long)params_1._M_p,(unsigned_long)pcVar1);
      __cxa_throw(this,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    buffer = (uint8_t *)operator_new__((ulong)params_1._M_p);
    (**(stream->super_ReadStream)._vptr_ReadStream)(stream,buffer,params_1._M_p);
    pcVar1 = (pointer)Checksum(buffer,params_1._M_p);
    if (local_40 != pcVar1) {
      pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "Corrupt WAL file: entry at byte position %llu computed checksum %llu does not match stored checksum %llu"
                 ,"");
      IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
                (pIVar2,&local_68,local_48,(unsigned_long)pcVar1,(unsigned_long)local_40);
      __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_38._M_head_impl = buffer;
    WriteAheadLogDeserializer
              (__return_storage_ptr__,state_p,
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)&local_38,
               (idx_t)params_1._M_p,deserialize_only);
    if (local_38._M_head_impl != (uint8_t *)0x0) {
      operator_delete__(local_38._M_head_impl);
    }
  }
  else {
    if (state_p->wal_version != 1) {
      pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "Failed to read WAL of version %llu - can only read version 1 and 2","");
      IOException::IOException<unsigned_long>(pIVar2,&local_68,state_p->wal_version);
      __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    WriteAheadLogDeserializer(__return_storage_ptr__,state_p,stream,deserialize_only);
  }
  return __return_storage_ptr__;
}

Assistant:

static WriteAheadLogDeserializer Open(ReplayState &state_p, BufferedFileReader &stream,
	                                      bool deserialize_only = false) {
		if (state_p.wal_version == 1) {
			// old WAL versions do not have checksums
			return WriteAheadLogDeserializer(state_p, stream, deserialize_only);
		}
		if (state_p.wal_version != 2) {
			throw IOException("Failed to read WAL of version %llu - can only read version 1 and 2",
			                  state_p.wal_version);
		}
		// read the checksum and size
		auto size = stream.Read<uint64_t>();
		auto stored_checksum = stream.Read<uint64_t>();
		auto offset = stream.CurrentOffset();
		auto file_size = stream.FileSize();

		if (offset + size > file_size) {
			throw SerializationException(
			    "Corrupt WAL file: entry size exceeded remaining data in file at byte position %llu "
			    "(found entry with size %llu bytes, file size %llu bytes)",
			    offset, size, file_size);
		}

		// allocate a buffer and read data into the buffer
		auto buffer = unique_ptr<data_t[]>(new data_t[size]);
		stream.ReadData(buffer.get(), size);

		// compute and verify the checksum
		auto computed_checksum = Checksum(buffer.get(), size);
		if (stored_checksum != computed_checksum) {
			throw IOException("Corrupt WAL file: entry at byte position %llu computed checksum %llu does not match "
			                  "stored checksum %llu",
			                  offset, computed_checksum, stored_checksum);
		}
		return WriteAheadLogDeserializer(state_p, std::move(buffer), size, deserialize_only);
	}